

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

size_type __thiscall
lf::fe::FeHierarchicQuad<double>::NumRefShapeFunctions(FeHierarchicQuad<double> *this,dim_t codim)

{
  value_type_conflict1 vVar1;
  const_reference pvVar2;
  runtime_error *this_00;
  ostream *this_01;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  stringstream local_3b0 [8];
  stringstream ss_1;
  ostream local_3a0 [376];
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  dim_t local_1c;
  FeHierarchicQuad<double> *pFStack_18;
  dim_t codim_local;
  FeHierarchicQuad<double> *this_local;
  
  if (codim == 0) {
    this_local._4_4_ = (this->interior_degree_ - 1) * (this->interior_degree_ - 1);
  }
  else {
    local_1c = codim;
    pFStack_18 = this;
    if (codim == 1) {
      pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,0);
      vVar1 = *pvVar2;
      pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,1);
      if (vVar1 == *pvVar2) {
        pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,0);
        vVar1 = *pvVar2;
        pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,2);
        if (vVar1 == *pvVar2) {
          pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,0);
          vVar1 = *pvVar2;
          pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,3);
          if (vVar1 == *pvVar2) {
            pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,0);
            return *pvVar2 - 1;
          }
        }
      }
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::operator<<(local_198,
                      "You cannot call this method with codim=1 if the edges of the quad have a differing number of shape functions."
                     );
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,
                 "edge_degrees_[0] == edge_degrees_[1] && edge_degrees_[0] == edge_degrees_[2] && edge_degrees_[0] == edge_degrees_[3]"
                 ,&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
                 ,&local_201);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1d8,&local_200,0x4ba,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (codim != 2) {
      std::__cxx11::stringstream::stringstream(local_3b0);
      this_01 = std::operator<<(local_3a0,"Illegal codim ");
      std::ostream::operator<<(this_01,local_1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"false",&local_3d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
                 ,&local_3f9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_3d0,&local_3f8,0x4bf,&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator(&local_3f9);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator(&local_3d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"false",&local_441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
                 ,&local_469);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"",&local_491);
      lf::base::AssertionFailed(&local_440,&local_468,0x4bf,&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator(&local_491);
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator(&local_469);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      abort();
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

[[nodiscard]] lf::base::size_type NumRefShapeFunctions(
      dim_t codim) const override {
    switch (codim) {
      case 0:
        return (interior_degree_ - 1) * (interior_degree_ - 1);
      case 1:
        LF_VERIFY_MSG(
            edge_degrees_[0] == edge_degrees_[1] &&
                edge_degrees_[0] == edge_degrees_[2] &&
                edge_degrees_[0] == edge_degrees_[3],
            "You cannot call this method with codim=1 if the edges of the "
            "quad have a differing number of shape functions.");
        return edge_degrees_[0] - 1;
      case 2:
        return 1;
      default:
        LF_ASSERT_MSG(false, "Illegal codim " << codim);
        // Silence compiler warnings
        return 0;
    }
  }